

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O0

void __thiscall
SkillTree::SkillTreeNode::SkillTreeNode
          (SkillTreeNode *this,string *title,string *flavourText,string *graphicPath,vf2d *pos,
          uint64_t cost)

{
  uint64_t cost_local;
  vf2d *pos_local;
  string *graphicPath_local;
  string *flavourText_local;
  string *title_local;
  SkillTreeNode *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)title);
  std::__cxx11::string::string((string *)&this->flavour,(string *)flavourText);
  olc::Renderable::Renderable(&this->graphic);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->deps);
  olc::v2d_generic<float>::v2d_generic(&this->pos,pos);
  this->completed = false;
  this->cost = cost;
  olc::Renderable::Load(&this->graphic,graphicPath,(ResourcePack *)0x0);
  return;
}

Assistant:

SkillTree::SkillTreeNode::SkillTreeNode(std::string title,
	std::string flavourText,
	std::string graphicPath,
	olc::vf2d pos,
	std::uint64_t cost)
    : title{title}, flavour{flavourText}, pos{pos}, cost{cost}
{
    graphic.Load(graphicPath);
}